

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O2

shared_ptr<gui::Style> __thiscall gui::Theme::getStyle(Theme *this,String *widgetName)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *this_00;
  iterator iVar1;
  __shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2> *this_01;
  runtime_error *this_02;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<gui::Style> sVar3;
  locale local_90 [8];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &(widgetName->m_string).field_2;
  iVar1 = std::
          _Rb_tree<sf::String,_std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>,_std::_Select1st<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
          ::find((_Rb_tree<sf::String,_std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>,_std::_Select1st<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
                  *)this_00,in_RDX);
  if (iVar1._M_node == (_Base_ptr)((long)&(widgetName->m_string).field_2 + 8)) {
    (**(code **)((widgetName->m_string)._M_dataplus._M_p + 4))(this,widgetName);
    if (this->_vptr_Theme == (_func_int **)0x0) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::locale::locale(local_90);
      sf::String::toAnsiString_abi_cxx11_(&local_88,in_RDX,local_90);
      std::operator+(&local_68,"theme failed to find style for \"",&local_88);
      std::operator+(&local_48,&local_68,"\".");
      std::runtime_error::runtime_error(this_02,(string *)&local_48);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = &std::
               map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
               ::operator[]((map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
                             *)this_00,in_RDX)->
               super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Style>)sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> Theme::getStyle(const sf::String& widgetName) const {
    auto styleIter = styles_.find(widgetName);
    if (styleIter != styles_.end()) {
        return styleIter->second;
    }

    auto style = loadStyle(widgetName);
    if (style == nullptr) {
        throw std::runtime_error("theme failed to find style for \"" + widgetName.toAnsiString() + "\".");
    }
    styles_[widgetName] = style;
    return style;
}